

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalBatchCopyToFile::Finalize
          (PhysicalBatchCopyToFile *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  Pipeline *args_2;
  idx_t iVar1;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::ProcessRemainingBatchesEvent,_true> new_event;
  
  args_2 = (Pipeline *)input->global_state;
  RepartitionBatches(this,context,(GlobalSinkState *)args_2,0x7fffffffffffffff,true);
  iVar1 = BatchTaskManager<duckdb::BatchCopyTask>::TaskCount
                    ((BatchTaskManager<duckdb::BatchCopyTask> *)
                     &(args_2->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
  ;
  if (iVar1 < 2) {
    ExecuteTasks(this,context,input->global_state);
    FinalFlush(this,context,input->global_state);
  }
  else {
    make_shared_ptr<duckdb::ProcessRemainingBatchesEvent,duckdb::PhysicalBatchCopyToFile_const&,duckdb::FixedBatchCopyGlobalState&,duckdb::Pipeline&,duckdb::ClientContext&>
              ((PhysicalBatchCopyToFile *)&new_event,(FixedBatchCopyGlobalState *)this,args_2,
               (ClientContext *)pipeline);
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         new_event.internal.
         super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = new_event.internal.
            super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    new_event.internal.
    super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    new_event.internal.
    super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Event::InsertEvent(event,&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_event.internal.
                super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalBatchCopyToFile::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                   OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto min_batch_index = idx_t(NumericLimits<int64_t>::Maximum());
	// repartition any remaining batches
	RepartitionBatches(context, input.global_state, min_batch_index, true);
	// check if we have multiple tasks to execute
	if (gstate.task_manager.TaskCount() <= 1) {
		// we don't - just execute the remaining task and finish flushing to disk
		ExecuteTasks(context, input.global_state);
		FinalFlush(context, input.global_state);
	} else {
		// we have multiple tasks remaining - launch an event to execute the tasks in parallel
		auto new_event = make_shared_ptr<ProcessRemainingBatchesEvent>(*this, gstate, pipeline, context);
		event.InsertEvent(std::move(new_event));
	}
	return SinkFinalizeType::READY;
}